

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directize.cpp
# Opt level: O3

void __thiscall wasm::anon_unknown_157::Directize::run(Directize *this,Module *module)

{
  char **ppcVar1;
  _Hash_node_base *p_Var2;
  Table *table_00;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>,_true>_>_>
  *p_Var3;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>,_true>_>_>
  *this_00;
  undefined8 *puVar4;
  undefined1 auVar5 [8];
  bool bVar6;
  iterator __begin3;
  mapped_type *pmVar7;
  FlatTable *this_01;
  long *plVar8;
  _Rb_tree_node_base *p_Var9;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *table;
  _Hash_node_base *p_Var10;
  undefined1 __dest [8];
  _Base_ptr p_Var11;
  undefined1 auStack_228 [8];
  Name name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208 [3];
  bool local_1d8;
  Expression **local_1d0;
  size_t sStack_1c8;
  pointer local_120;
  pointer pTStack_118;
  pointer local_110;
  Function *pFStack_108;
  Module *local_100;
  undefined1 *local_f8;
  undefined1 local_f0;
  undefined1 local_e0 [8];
  ParallelFunctionAnalysis<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  analysis;
  undefined1 local_78 [8];
  TableInfoMap tables;
  
  if ((module->tables).
      super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (module->tables).
      super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return;
  }
  ppcVar1 = &name.super_IString.str._M_str;
  local_78 = (undefined1  [8])&DAT_00000024;
  auStack_228 = (undefined1  [8])ppcVar1;
  tables._M_h._M_single_bucket = (__node_base_ptr)module;
  auStack_228 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)auStack_228,(ulong)local_78);
  __dest = (undefined1  [8])auStack_228;
  name.super_IString.str._M_str = (char *)local_78;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)&(((__node_ptr)auStack_228)->
              super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>,_true>
              ).
              super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>
              ._M_storage._M_storage + 8))->_M_allocated_capacity = 0x6e65746e6f632d6c;
  builtin_strncpy((char *)((long)&(((__node_ptr)auStack_228)->
                                  super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>,_true>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>
                                  ._M_storage._M_storage + 0x10),"ts-immut",8);
  (((__node_ptr)auStack_228)->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x7a69746365726964;
  (((__node_ptr)auStack_228)->
  super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>,_true>)
  .super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>
  ._M_storage._M_storage.__align = (anon_struct_8_0_00000001_for___align)0x616974696e692d65;
  *(undefined4 *)
   ((long)&(((__node_ptr)auStack_228)->
           super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>
           ._M_storage._M_storage + 0x18) = 0x656c6261;
  name.super_IString.str._M_len = (size_t)local_78;
  *(char *)((long)&(((__node_ptr)auStack_228)->super__Hash_node_base)._M_nxt + (long)local_78) =
       '\0';
  bVar6 = Pass::hasArgument(&this->super_Pass,(string *)__dest);
  if (auStack_228 != (undefined1  [8])ppcVar1) {
    __dest = (undefined1  [8])(name.super_IString.str._M_str + 1);
    operator_delete((void *)auStack_228,(ulong)__dest);
  }
  local_78 = (undefined1  [8])&tables._M_h._M_rehash_policy._M_next_resize;
  tables._M_h._M_buckets = (__buckets_ptr)0x1;
  tables._M_h._M_bucket_count = 0;
  tables._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  tables._M_h._M_element_count._0_4_ = 0x3f800000;
  tables._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  tables._M_h._M_rehash_policy._4_4_ = 0;
  tables._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var10 = tables._M_h._M_single_bucket[0x15]._M_nxt;
  p_Var2 = tables._M_h._M_single_bucket[0x16]._M_nxt;
  if (p_Var10 != p_Var2) {
    do {
      pmVar7 = std::
               unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
               ::operator[]((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                             *)local_78,(key_type *)p_Var10->_M_nxt);
      pmVar7->initialContentsImmutable = bVar6;
      table_00 = (Table *)p_Var10->_M_nxt;
      this_01 = (FlatTable *)operator_new(0x20);
      TableUtils::FlatTable::FlatTable(this_01,(Module *)tables._M_h._M_single_bucket,table_00);
      auStack_228 = (undefined1  [8])this_01;
      pmVar7 = std::
               unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
               ::operator[]((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                             *)local_78,(key_type *)p_Var10->_M_nxt);
      auVar5 = auStack_228;
      auStack_228 = (undefined1  [8])0x0;
      __dest = (undefined1  [8])
               (pmVar7->flatTable)._M_t.
               super___uniq_ptr_impl<wasm::TableUtils::FlatTable,_std::default_delete<wasm::TableUtils::FlatTable>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TableUtils::FlatTable_*,_std::default_delete<wasm::TableUtils::FlatTable>_>
               .super__Head_base<0UL,_wasm::TableUtils::FlatTable_*,_false>._M_head_impl;
      (pmVar7->flatTable)._M_t.
      super___uniq_ptr_impl<wasm::TableUtils::FlatTable,_std::default_delete<wasm::TableUtils::FlatTable>_>
      ._M_t.
      super__Tuple_impl<0UL,_wasm::TableUtils::FlatTable_*,_std::default_delete<wasm::TableUtils::FlatTable>_>
      .super__Head_base<0UL,_wasm::TableUtils::FlatTable_*,_false>._M_head_impl =
           (FlatTable *)auVar5;
      if ((__dest != (undefined1  [8])0x0) &&
         (std::default_delete<wasm::TableUtils::FlatTable>::operator()
                    ((default_delete<wasm::TableUtils::FlatTable> *)&pmVar7->flatTable,
                     (FlatTable *)__dest), __dest = auStack_228, auStack_228 != (undefined1  [8])0x0
         )) {
        std::default_delete<wasm::TableUtils::FlatTable>::operator()
                  ((default_delete<wasm::TableUtils::FlatTable> *)auStack_228,
                   (FlatTable *)auStack_228);
      }
      p_Var10 = p_Var10 + 1;
    } while (p_Var10 != p_Var2);
    p_Var10 = tables._M_h._M_single_bucket[0x15]._M_nxt;
    p_Var2 = tables._M_h._M_single_bucket[0x16]._M_nxt;
    if (p_Var10 != p_Var2) {
      do {
        __dest = (undefined1  [8])p_Var10->_M_nxt;
        if (*(long *)((long)&(((__node_ptr)__dest)->
                             super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>
                             ._M_storage._M_storage + 0x18) != 0) {
          pmVar7 = std::
                   unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                   ::operator[]((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                                 *)local_78,(key_type *)__dest);
          pmVar7->mayBeModified = true;
        }
        p_Var10 = p_Var10 + 1;
      } while (p_Var10 != p_Var2);
    }
  }
  p_Var10 = (tables._M_h._M_single_bucket)->_M_nxt;
  p_Var2 = tables._M_h._M_single_bucket[1]._M_nxt;
  if (p_Var10 != p_Var2) {
    do {
      __dest = (undefined1  [8])p_Var10->_M_nxt;
      if (*(int *)((long)&(((__node_ptr)__dest)->
                          super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>,_true>
                          ).
                          super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>
                          ._M_storage._M_storage + 8) == 1) {
        if ((char)(((__node_ptr)__dest)->
                  super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>,_true>
                  ).super__Hash_node_code_cache<true>._M_hash_code == '\0') {
          __dest = (undefined1  [8])
                   ((long)&(((__node_ptr)__dest)->
                           super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>,_true>
                           ).
                           super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>
                           ._M_storage._M_storage + 0x10);
        }
        else {
          __dest = (undefined1  [8])0x0;
        }
        pmVar7 = std::
                 unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                 ::operator[]((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                               *)local_78,(key_type *)__dest);
        pmVar7->mayBeModified = true;
      }
      p_Var10 = p_Var10 + 1;
    } while (p_Var10 != p_Var2);
  }
  plVar8 = (long *)tables._M_h._M_bucket_count;
  if (tables._M_h._M_bucket_count == 0) goto LAB_0084ae92;
  do {
    if ((((char)plVar8[3] != '\x01') || (*(char *)((long)plVar8 + 0x19) == '\x01')) &&
       (*(char *)(plVar8[4] + 0x18) != '\0')) {
      analysis._48_8_ = 0;
      wasm::ModuleUtils::
      ParallelFunctionAnalysis<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
      ::ParallelFunctionAnalysis
                ((ParallelFunctionAnalysis<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                  *)local_e0,(Module *)tables._M_h._M_single_bucket,(Func *)&analysis.field_0x30);
      __dest = (undefined1  [8])&analysis.field_0x30;
      std::
      _Function_handler<void_(wasm::Function_*,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Directize.cpp:250:16)>
      ::_M_manager((_Any_data *)__dest,(_Any_data *)__dest,__destroy_functor);
      puVar4 = (undefined8 *)tables._M_h._M_bucket_count;
      if ((undefined1 *)analysis._24_8_ != &analysis.field_0x8) {
        p_Var9 = (_Rb_tree_node_base *)analysis._24_8_;
        do {
          for (p_Var11 = p_Var9[1]._M_right; p_Var11 != (_Base_ptr)0x0;
              p_Var11 = *(_Base_ptr *)p_Var11) {
            auStack_228 = (undefined1  [8])p_Var11->_M_parent;
            name.super_IString.str._M_len = (size_t)p_Var11->_M_left;
            __dest = (undefined1  [8])auStack_228;
            pmVar7 = std::
                     unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                     ::operator[]((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                                   *)local_78,(key_type *)auStack_228);
            pmVar7->mayBeModified = true;
          }
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
          puVar4 = (undefined8 *)tables._M_h._M_bucket_count;
        } while (p_Var9 != (_Rb_tree_node_base *)&analysis.field_0x8);
      }
      goto joined_r0x0084adb3;
    }
    plVar8 = (long *)*plVar8;
    this_00 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>,_true>_>_>
               *)tables._M_h._M_bucket_count;
  } while (plVar8 != (long *)0x0);
joined_r0x0084ae80:
  while (this_00 !=
         (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>,_true>_>_>
          *)0x0) {
    p_Var3 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>,_true>_>_>
               **)this_00;
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>,_true>_>_>
    ::_M_deallocate_node(this_00,(__node_ptr)__dest);
    this_00 = p_Var3;
  }
LAB_0084ae92:
  memset((void *)local_78,0,(long)tables._M_h._M_buckets << 3);
  tables._M_h._M_bucket_count = 0;
  tables._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  if ((undefined1  [8])&tables._M_h._M_rehash_policy._M_next_resize != local_78) {
    operator_delete((void *)local_78,(long)tables._M_h._M_buckets << 3);
  }
  return;
joined_r0x0084adb3:
  if (puVar4 == (undefined8 *)0x0) goto LAB_0084ae6d;
  if (((*(char *)(puVar4 + 3) != '\x01') || (*(char *)((long)puVar4 + 0x19) == '\x01')) &&
     (*(char *)(puVar4[4] + 0x18) != '\0')) {
    name.super_IString.str._M_str = (char *)local_208;
    local_208[0]._M_local_buf[0] = '\0';
    local_1d8 = false;
    local_1d0 = (Expression **)0x0;
    sStack_1c8 = 0;
    local_120 = (pointer)0x0;
    pTStack_118 = (pointer)0x0;
    local_110 = (pointer)0x0;
    pFStack_108 = (Function *)0x0;
    local_100 = (Module *)0x0;
    auStack_228 = (undefined1  [8])&PTR__WalkerPass_01072170;
    local_f8 = local_78;
    local_f0 = 0;
    name.super_IString.str._M_len = (size_t)(this->super_Pass).runner;
    __dest = (undefined1  [8])tables._M_h._M_single_bucket;
    WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionDirectizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionDirectizer,_void>_>_>
    ::run((WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionDirectizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionDirectizer,_void>_>_>
           *)auStack_228,(Module *)tables._M_h._M_single_bucket);
    if (local_120 != (pointer)0x0) {
      __dest = (undefined1  [8])((long)local_110 - (long)local_120);
      operator_delete(local_120,(ulong)__dest);
    }
    Pass::~Pass((Pass *)auStack_228);
    goto LAB_0084ae6d;
  }
  puVar4 = (undefined8 *)*puVar4;
  goto joined_r0x0084adb3;
LAB_0084ae6d:
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
               *)&analysis);
  this_00 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>,_true>_>_>
             *)tables._M_h._M_bucket_count;
  goto joined_r0x0084ae80;
}

Assistant:

void run(Module* module) override {
    if (module->tables.empty()) {
      return;
    }

    // TODO: consider a per-table option here
    auto initialContentsImmutable =
      hasArgument("directize-initial-contents-immutable");

    // Set up the initial info.
    TableInfoMap tables;
    for (auto& table : module->tables) {
      tables[table->name].initialContentsImmutable = initialContentsImmutable;
      tables[table->name].flatTable =
        std::make_unique<TableUtils::FlatTable>(*module, *table);
    }

    // Next, look at the imports and exports.

    for (auto& table : module->tables) {
      if (table->imported()) {
        tables[table->name].mayBeModified = true;
      }
    }

    for (auto& ex : module->exports) {
      if (ex->kind == ExternalKind::Table) {
        tables[*ex->getInternalName()].mayBeModified = true;
      }
    }

    // This may already be enough information to know that we can't optimize
    // anything. If so, skip scanning all the module contents.
    auto canOptimize = [&]() {
      for (auto& [_, info] : tables) {
        if (info.canOptimize()) {
          return true;
        }
      }
      return false;
    };

    if (!canOptimize()) {
      return;
    }

    // Find which tables have sets.

    using TablesWithSet = std::unordered_set<Name>;

    ModuleUtils::ParallelFunctionAnalysis<TablesWithSet> analysis(
      *module, [&](Function* func, TablesWithSet& tablesWithSet) {
        if (func->imported()) {
          return;
        }

        struct Finder : public PostWalker<Finder> {
          TablesWithSet& tablesWithSet;

          Finder(TablesWithSet& tablesWithSet) : tablesWithSet(tablesWithSet) {}

          void visitTableSet(TableSet* curr) {
            tablesWithSet.insert(curr->table);
          }
          void visitTableFill(TableFill* curr) {
            tablesWithSet.insert(curr->table);
          }
          void visitTableCopy(TableCopy* curr) {
            tablesWithSet.insert(curr->destTable);
          }
          void visitTableInit(TableInit* curr) {
            tablesWithSet.insert(curr->table);
          }
        };

        Finder(tablesWithSet).walkFunction(func);
      });

    for (auto& [_, names] : analysis.map) {
      for (auto name : names) {
        tables[name].mayBeModified = true;
      }
    }

    // Perhaps the new information about tables with sets shows we cannot
    // optimize.
    if (!canOptimize()) {
      return;
    }

    // We can optimize!
    FunctionDirectizer(tables).run(getPassRunner(), module);
  }